

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O3

PGRangeVar * duckdb_libpgquery::makeRangeVar(char *schemaname,char *relname,int location)

{
  PGRangeVar *pPVar1;
  
  pPVar1 = (PGRangeVar *)newNode(0x48,T_PGRangeVar);
  pPVar1->catalogname = (char *)0x0;
  pPVar1->schemaname = schemaname;
  pPVar1->relname = relname;
  pPVar1->inh = true;
  pPVar1->relpersistence = '\x02';
  pPVar1->alias = (PGAlias *)0x0;
  pPVar1->location = location;
  pPVar1->sample = (PGNode *)0x0;
  return pPVar1;
}

Assistant:

PGRangeVar *makeRangeVar(char *schemaname, char *relname, int location) {
	PGRangeVar *r = makeNode(PGRangeVar);

	r->catalogname = NULL;
	r->schemaname = schemaname;
	r->relname = relname;
	r->inh = true;
	r->relpersistence = RELPERSISTENCE_PERMANENT;
	r->alias = NULL;
	r->location = location;
	r->sample = NULL;

	return r;
}